

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

complex<float> __thiscall
TPZFYsmpMatrix<std::complex<float>_>::GetVal
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t row,int64_t col)

{
  long *plVar1;
  _ComplexT _Var2;
  long lVar3;
  complex<float> cVar4;
  
  plVar1 = (this->fIA).fStore;
  cVar4._M_value = plVar1[row];
  _Var2 = plVar1[row + 1];
  if ((long)cVar4._M_value < (long)_Var2) {
    do {
      lVar3 = (this->fJA).fStore[cVar4._M_value];
      if (lVar3 != -1 && lVar3 == col) {
        return (complex<float>)cVar4._M_value;
      }
      cVar4._M_value = cVar4._M_value + 1;
    } while (_Var2 != cVar4._M_value);
  }
  return (complex<float>)cVar4._M_value;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}